

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tabs.cxx
# Opt level: O2

void __thiscall Fl_Tabs::draw(Fl_Tabs *this)

{
  Fl_Color c;
  int H;
  uint uVar1;
  Fl_Tabs *widget;
  Fl_Tabs *pFVar2;
  Fl_Widget **ppFVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ulong uVar10;
  long lVar9;
  
  widget = (Fl_Tabs *)value(this);
  H = tab_height(this);
  if ((char)(this->super_Fl_Group).super_Fl_Widget.damage_ < '\0') {
    pFVar2 = widget;
    if (widget == (Fl_Tabs *)0x0) {
      pFVar2 = this;
    }
    c = (pFVar2->super_Fl_Group).super_Fl_Widget.color_;
    iVar5 = 0;
    if (-1 < H) {
      iVar5 = H;
    }
    iVar6 = -H;
    if (H < 1) {
      iVar6 = H;
    }
    Fl_Widget::draw_box((Fl_Widget *)this,(uint)(this->super_Fl_Group).super_Fl_Widget.box_,
                        (this->super_Fl_Group).super_Fl_Widget.x_,
                        iVar5 + (this->super_Fl_Group).super_Fl_Widget.y_,
                        (this->super_Fl_Group).super_Fl_Widget.w_,
                        iVar6 + (this->super_Fl_Group).super_Fl_Widget.h_,c);
    if ((this->super_Fl_Group).super_Fl_Widget.color2_ != c) {
      iVar5 = (this->super_Fl_Group).super_Fl_Widget.y_;
      if (H < 0) {
        uVar1 = (iVar5 + H + (this->super_Fl_Group).super_Fl_Widget.h_) - 5;
      }
      else {
        uVar1 = iVar5 + H;
      }
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
                (fl_graphics_driver,(ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.x_,
                 (ulong)uVar1,(ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.w_,5);
      Fl_Widget::draw_box((Fl_Widget *)this,(uint)(this->super_Fl_Group).super_Fl_Widget.box_,
                          (this->super_Fl_Group).super_Fl_Widget.x_,uVar1,
                          (this->super_Fl_Group).super_Fl_Widget.w_,5,
                          (this->super_Fl_Group).super_Fl_Widget.color2_);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
    }
    if (widget != (Fl_Tabs *)0x0) {
      Fl_Group::draw_child(&this->super_Fl_Group,(Fl_Widget *)widget);
    }
  }
  else if (widget != (Fl_Tabs *)0x0) {
    Fl_Group::update_child(&this->super_Fl_Group,(Fl_Widget *)widget);
  }
  if (((this->super_Fl_Group).super_Fl_Widget.damage_ & 0x84) != 0) {
    iVar5 = (this->super_Fl_Group).children_;
    uVar1 = tab_positions(this);
    ppFVar3 = Fl_Group::array(&this->super_Fl_Group);
    uVar4 = 0;
    uVar10 = 0;
    if (0 < (int)uVar1) {
      uVar10 = (ulong)uVar1;
    }
    for (; uVar10 != uVar4; uVar4 = uVar4 + 1) {
      iVar6 = (this->super_Fl_Group).super_Fl_Widget.x_;
      draw_tab(this,this->tab_pos[uVar4] + iVar6,iVar6 + this->tab_pos[uVar4 + 1],
               this->tab_width[uVar4],H,ppFVar3[uVar4],0);
    }
    lVar7 = (long)(int)uVar1;
    lVar9 = (long)iVar5;
    while (lVar8 = lVar9 + -1, lVar7 < lVar8) {
      iVar5 = (this->super_Fl_Group).super_Fl_Widget.x_;
      draw_tab(this,this->tab_pos[lVar8] + iVar5,iVar5 + this->tab_pos[lVar9],this->tab_width[lVar8]
               ,H,ppFVar3[lVar8],1);
      lVar9 = lVar8;
    }
    if (widget != (Fl_Tabs *)0x0) {
      iVar5 = (this->super_Fl_Group).super_Fl_Widget.x_;
      draw_tab(this,this->tab_pos[lVar7] + iVar5,iVar5 + this->tab_pos[lVar7 + 1],
               this->tab_width[lVar7],H,ppFVar3[lVar7],2);
    }
  }
  return;
}

Assistant:

void Fl_Tabs::draw() {
  Fl_Widget *v = value();
  int H = tab_height();

  if (damage() & FL_DAMAGE_ALL) { // redraw the entire thing:
    Fl_Color c = v ? v->color() : color();

    draw_box(box(), x(), y()+(H>=0?H:0), w(), h()-(H>=0?H:-H), c);

    if (selection_color() != c) {
      // Draw the top or bottom SELECTION_BORDER lines of the tab pane in the
      // selection color so that the user knows which tab is selected...
      int clip_y = (H >= 0) ? y() + H : y() + h() + H - SELECTION_BORDER;
      fl_push_clip(x(), clip_y, w(), SELECTION_BORDER);
      draw_box(box(), x(), clip_y, w(), SELECTION_BORDER, selection_color());
      fl_pop_clip();
    }
    if (v) draw_child(*v);
  } else { // redraw the child
    if (v) update_child(*v);
  }
  if (damage() & (FL_DAMAGE_SCROLL|FL_DAMAGE_ALL)) {
    const int nc = children();
    int selected = tab_positions();
    int i;
    Fl_Widget*const* a = array();
    for (i=0; i<selected; i++)
      draw_tab(x()+tab_pos[i], x()+tab_pos[i+1],
               tab_width[i], H, a[i], LEFT);
    for (i=nc-1; i > selected; i--)
      draw_tab(x()+tab_pos[i], x()+tab_pos[i+1],
               tab_width[i], H, a[i], RIGHT);
    if (v) {
      i = selected;
      draw_tab(x()+tab_pos[i], x()+tab_pos[i+1],
               tab_width[i], H, a[i], SELECTED);
    }
  }
}